

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_adapter.c
# Opt level: O2

size_t UNIT_conv_string_to_letter_utf8(char *s,MAFSA_letter *l,size_t sz_l)

{
  char cVar1;
  size_t pos;
  byte bVar2;
  u_char *i;
  
  pos = 0;
  do {
    cVar1 = s[pos];
    if ((cVar1 == '\0') || (sz_l <= pos)) {
      return pos;
    }
    if (cVar1 == '\'') {
      bVar2 = 0x1b;
    }
    else if (cVar1 == '-') {
      bVar2 = 0x1a;
    }
    else {
      bVar2 = cVar1 + 0xbf;
      if ((0x19 < bVar2) && (bVar2 = cVar1 + 0x9f, 0x19 < bVar2)) {
        return pos;
      }
    }
    l[pos] = bVar2;
    pos = pos + 1;
  } while( true );
}

Assistant:

size_t UNIT_conv_string_to_letter_utf8(const char *s, MAFSA_letter *l, size_t sz_l)
{
    const u_char *i = (const u_char *) s;
    size_t pos = 0;
    while (*i && pos < sz_l)
    {
        if (i[0] == '\'')
        {
            l[pos] = UNIT_LETTER_APOSTROPHE;
        }
        else if (i[0] == '-')
        {
            l[pos] = UNIT_LETTER_DIFFIS;
        }
        else
        {
            if ((i[0] >= 'A') && (i[0] <= 'Z'))
            {
                l[pos] = (MAFSA_letter) (i[0] - 'A');
            }
            else if ((i[0] >= 'a') && (i[0] <= 'z'))
            {
                l[pos] = (MAFSA_letter) (i[0] - 'a');
            }
            else
            {
                return pos;
            }
        }
        ++i;
        ++pos;
    }
    return pos;
}